

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprpc.cpp
# Opt level: O2

bool __thiscall
mprpc::MpRpcServer::send_error_rsp
          (MpRpcServer *this,shared_ptr<mprpc::ClientConnection> *conn,
          shared_ptr<mprpc::MpRpcMessage> *req,int error,string *err_msg)

{
  long lVar1;
  ssize_t sVar2;
  __shared_ptr<mprpc::ClientConnection,_(__gnu_cxx::_Lock_policy)2> *this_00;
  int __flags;
  char local_69;
  MsgPackPacker pk;
  __shared_ptr<mprpc::ClientConnection,_(__gnu_cxx::_Lock_policy)2> local_38;
  
  __flags = (int)err_msg;
  pk.sb.size = 0;
  pk.sb.data = (char *)0x0;
  pk.sb.alloc = 0;
  pk.pk.callback = msgpack_sbuffer_write;
  local_69 = -0x7c;
  pk.pk.data = &pk;
  msgpack_sbuffer_write(&pk,&local_69,1);
  MsgPackPacker::pack_map_item
            (&pk,"id",((req->super___shared_ptr<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr)->id);
  MsgPackPacker::pack_map_item
            (&pk,"method",
             &((req->super___shared_ptr<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              method);
  MsgPackPacker::pack_string(&pk,"error",0);
  local_69 = -0x7e;
  (*pk.pk.callback)(pk.pk.data,&local_69,1);
  MsgPackPacker::pack_map_item(&pk,"code",error);
  MsgPackPacker::pack_map_item(&pk,"message",err_msg);
  MsgPackPacker::pack_string(&pk,"debug",0);
  local_69 = -0x7e;
  (*pk.pk.callback)(pk.pk.data,&local_69,1);
  MsgPackPacker::pack_map_item
            (&pk,"recv_time",
             (((req->super___shared_ptr<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
             recv_time).__d.__r / 1000);
  lVar1 = std::chrono::_V2::system_clock::now();
  MsgPackPacker::pack_map_item(&pk,"send_time",lVar1 / 1000);
  this_00 = &local_38;
  std::__shared_ptr<mprpc::ClientConnection,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_38,
             &conn->super___shared_ptr<mprpc::ClientConnection,_(__gnu_cxx::_Lock_policy)2>);
  sVar2 = send((MpRpcServer *)this_00,(int)&local_38,pk.sb.data,pk.sb.size,__flags);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
  free(pk.sb.data);
  return (bool)(char)sVar2;
}

Assistant:

bool MpRpcServer::send_error_rsp(shared_ptr<mprpc::ClientConnection> conn,
                                    shared_ptr<mprpc::MpRpcMessage> req,
                                    int error,
                                    const string& err_msg)
    {
        MsgPackPacker pk;
        pk.pack_map(4);

        pk.pack_map_item("id", req->id);
        pk.pack_map_item("method", req->method);

        pk.pack_string("error");
        pk.pack_map(2);
        pk.pack_map_item("code", error);
        pk.pack_map_item("message", err_msg);

        pk.pack_string("debug");
        pk.pack_map(2);
        pk.pack_map_item("recv_time", (uint64_t)time_point_cast<microseconds>(req->recv_time).time_since_epoch().count());
        pk.pack_map_item("send_time", (uint64_t)time_point_cast<microseconds>(system_clock::now()).time_since_epoch().count());

        return send(conn, pk.sb.data, pk.sb.size);
    }